

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O0

void __thiscall
BattleWithLandlord::Move
          (BattleWithLandlord *this,multiset<char,_std::less<char>,_std::allocator<char>_> *pattern)

{
  bool bVar1;
  size_type sVar2;
  undefined8 in_RSI;
  const_iterator in_RDI;
  char x;
  iterator __end2;
  iterator __begin2;
  multiset<char,_std::less<char>,_std::allocator<char>_> *__range2;
  multiset<char,_std::less<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  multiset<char,_std::less<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  _Self local_28;
  _Self local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  sVar2 = std::multiset<char,_std::less<char>,_std::allocator<char>_>::size
                    ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x11f932);
  if (sVar2 != 0) {
    local_18 = local_10;
    local_20._M_node =
         (_Base_ptr)
         std::multiset<char,_std::less<char>,_std::allocator<char>_>::begin
                   (in_stack_ffffffffffffffa8);
    local_28._M_node =
         (_Base_ptr)
         std::multiset<char,_std::less<char>,_std::allocator<char>_>::end(in_stack_ffffffffffffffa8)
    ;
    while (bVar1 = std::operator!=(&local_20,&local_28), bVar1) {
      std::_Rb_tree_const_iterator<char>::operator*
                ((_Rb_tree_const_iterator<char> *)in_stack_ffffffffffffffb0);
      in_stack_ffffffffffffffb0 =
           (multiset<char,_std::less<char>,_std::allocator<char>_> *)
           ((long)in_RDI._M_node +
           (long)(int)(((_Rb_tree_header *)&in_RDI._M_node[9]._M_parent)->_M_header)._M_color * 0x30
           + 0x70);
      std::multiset<char,_std::less<char>,_std::allocator<char>_>::find
                ((multiset<char,_std::less<char>,_std::allocator<char>_> *)in_RDI._M_node,
                 (key_type *)in_stack_ffffffffffffffb0);
      std::multiset<char,std::less<char>,std::allocator<char>>::erase_abi_cxx11_
                (in_stack_ffffffffffffffb0,in_RDI);
      std::_Rb_tree_const_iterator<char>::operator++
                ((_Rb_tree_const_iterator<char> *)in_stack_ffffffffffffffb0);
    }
  }
  (((_Rb_tree_header *)&in_RDI._M_node[9]._M_parent)->_M_header)._M_color =
       _S_black - (((_Rb_tree_header *)&in_RDI._M_node[9]._M_parent)->_M_header)._M_color;
  *(int *)&(((_Rb_tree_header *)&in_RDI._M_node[9]._M_parent)->_M_header).field_0x4 =
       *(int *)&(((_Rb_tree_header *)&in_RDI._M_node[9]._M_parent)->_M_header).field_0x4 + 1;
  return;
}

Assistant:

void BattleWithLandlord::Move(const multiset<byte> &pattern) {
    if (pattern.size()) {
        for (auto x: pattern) {
            _cards[_side].erase(_cards[_side].find(x));
        }
    }
    _side = 1 - _side;
    ++_round;
}